

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int backtrack_loop(saucy *s)

{
  int iVar1;
  int min;
  saucy *s_local;
  
  s->lev = s->lev + -1;
  while( true ) {
    if (s->lev == 0) {
      return -1;
    }
    iVar1 = do_backtrack(s);
    if (iVar1 != -1) break;
    s->lev = s->lev + -1;
  }
  return iVar1 + s->start[s->lev];
}

Assistant:

static int
backtrack_loop(struct saucy *s)
{
    int min;

    /* Backtrack as long as we're exhausting target cells */
    for (--s->lev; s->lev; --s->lev) {
        min = do_backtrack(s);
        if (min != -1) return min + s->start[s->lev];
    }
    return -1;
}